

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::GRULayerParams::Clear(GRULayerParams *this)

{
  Arena *pAVar1;
  GRULayerParams *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::Clear
            (&this->activations_);
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->updategateweightmatrix_ != (WeightParams *)0x0)) &&
     (this->updategateweightmatrix_ != (WeightParams *)0x0)) {
    (*(this->updategateweightmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->updategateweightmatrix_ = (WeightParams *)0x0;
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->resetgateweightmatrix_ != (WeightParams *)0x0)) &&
     (this->resetgateweightmatrix_ != (WeightParams *)0x0)) {
    (*(this->resetgateweightmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->resetgateweightmatrix_ = (WeightParams *)0x0;
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->outputgateweightmatrix_ != (WeightParams *)0x0)) &&
     (this->outputgateweightmatrix_ != (WeightParams *)0x0)) {
    (*(this->outputgateweightmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->outputgateweightmatrix_ = (WeightParams *)0x0;
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->updategaterecursionmatrix_ != (WeightParams *)0x0)) &&
     (this->updategaterecursionmatrix_ != (WeightParams *)0x0)) {
    (*(this->updategaterecursionmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->updategaterecursionmatrix_ = (WeightParams *)0x0;
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->resetgaterecursionmatrix_ != (WeightParams *)0x0)) &&
     (this->resetgaterecursionmatrix_ != (WeightParams *)0x0)) {
    (*(this->resetgaterecursionmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->resetgaterecursionmatrix_ = (WeightParams *)0x0;
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->outputgaterecursionmatrix_ != (WeightParams *)0x0)) &&
     (this->outputgaterecursionmatrix_ != (WeightParams *)0x0)) {
    (*(this->outputgaterecursionmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->outputgaterecursionmatrix_ = (WeightParams *)0x0;
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->updategatebiasvector_ != (WeightParams *)0x0)) &&
     (this->updategatebiasvector_ != (WeightParams *)0x0)) {
    (*(this->updategatebiasvector_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->updategatebiasvector_ = (WeightParams *)0x0;
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->resetgatebiasvector_ != (WeightParams *)0x0)) &&
     (this->resetgatebiasvector_ != (WeightParams *)0x0)) {
    (*(this->resetgatebiasvector_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->resetgatebiasvector_ = (WeightParams *)0x0;
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->outputgatebiasvector_ != (WeightParams *)0x0)) &&
     (this->outputgatebiasvector_ != (WeightParams *)0x0)) {
    (*(this->outputgatebiasvector_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->outputgatebiasvector_ = (WeightParams *)0x0;
  memset(&this->inputvectorsize_,0,0x13);
  return;
}

Assistant:

void GRULayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.GRULayerParams)
  activations_.Clear();
  if (GetArenaNoVirtual() == NULL && updategateweightmatrix_ != NULL) {
    delete updategateweightmatrix_;
  }
  updategateweightmatrix_ = NULL;
  if (GetArenaNoVirtual() == NULL && resetgateweightmatrix_ != NULL) {
    delete resetgateweightmatrix_;
  }
  resetgateweightmatrix_ = NULL;
  if (GetArenaNoVirtual() == NULL && outputgateweightmatrix_ != NULL) {
    delete outputgateweightmatrix_;
  }
  outputgateweightmatrix_ = NULL;
  if (GetArenaNoVirtual() == NULL && updategaterecursionmatrix_ != NULL) {
    delete updategaterecursionmatrix_;
  }
  updategaterecursionmatrix_ = NULL;
  if (GetArenaNoVirtual() == NULL && resetgaterecursionmatrix_ != NULL) {
    delete resetgaterecursionmatrix_;
  }
  resetgaterecursionmatrix_ = NULL;
  if (GetArenaNoVirtual() == NULL && outputgaterecursionmatrix_ != NULL) {
    delete outputgaterecursionmatrix_;
  }
  outputgaterecursionmatrix_ = NULL;
  if (GetArenaNoVirtual() == NULL && updategatebiasvector_ != NULL) {
    delete updategatebiasvector_;
  }
  updategatebiasvector_ = NULL;
  if (GetArenaNoVirtual() == NULL && resetgatebiasvector_ != NULL) {
    delete resetgatebiasvector_;
  }
  resetgatebiasvector_ = NULL;
  if (GetArenaNoVirtual() == NULL && outputgatebiasvector_ != NULL) {
    delete outputgatebiasvector_;
  }
  outputgatebiasvector_ = NULL;
  ::memset(&inputvectorsize_, 0, reinterpret_cast<char*>(&reverseinput_) -
    reinterpret_cast<char*>(&inputvectorsize_) + sizeof(reverseinput_));
}